

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_PrintTestIgnored_TestShell::
~TEST_TeamCityOutputTest_PrintTestIgnored_TestShell
          (TEST_TeamCityOutputTest_PrintTestIgnored_TestShell *this)

{
  TEST_TeamCityOutputTest_PrintTestIgnored_TestShell *this_local;
  
  ~TEST_TeamCityOutputTest_PrintTestIgnored_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TeamCityOutputTest, PrintTestIgnored)
{
    const char* expected =
        "##teamcity[testStarted name='test']\n"
        "##teamcity[testIgnored name='test']\n"
        "##teamcity[testFinished name='test' duration='41']\n";

    IgnoredUtestShell* itst = new IgnoredUtestShell("group", "test", "file", 10);
    result->currentTestStarted(itst);
    millisTime = 41;
    result->currentTestEnded(itst);
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
    delete itst;
}